

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

wchar_t tty_noquotemode(EditLine *el)

{
  wchar_t wVar1;
  EditLine *el_local;
  
  if ((el->el_tty).t_mode == '\x02') {
    wVar1 = tty_setty(el,L'\x01',&(el->el_tty).t_ed);
    if (wVar1 == L'\xffffffff') {
      el_local._4_4_ = L'\xffffffff';
    }
    else {
      (el->el_tty).t_mode = '\x01';
      el_local._4_4_ = L'\0';
    }
  }
  else {
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
tty_noquotemode(EditLine *el)
{

	if (el->el_tty.t_mode != QU_IO)
		return 0;
	if (tty_setty(el, TCSADRAIN, &el->el_tty.t_ed) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	el->el_tty.t_mode = ED_IO;
	return 0;
}